

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O0

void __thiscall fasttext::FastText::startThreads(FastText *this)

{
  undefined4 uVar1;
  bool bVar2;
  element_type *peVar3;
  element_type *this_00;
  duration<long,_std::ratio<1L,_1000L>_> *__rtime;
  __int_type_conflict _Var4;
  ostream *this_01;
  ostream *in_RDI;
  float fVar5;
  undefined1 auVar6 [12];
  exception_ptr exception;
  int32_t i_1;
  real progress;
  int64_t ntokens;
  int32_t i;
  vector<std::thread,_std::allocator<std::thread>_> threads;
  undefined4 in_stack_ffffffffffffff18;
  float in_stack_ffffffffffffff1c;
  vector<std::thread,_std::allocator<std::thread>_> *in_stack_ffffffffffffff20;
  exception_ptr *in_stack_ffffffffffffff28;
  exception_ptr *this_02;
  FastText *in_stack_ffffffffffffff30;
  vector<std::thread,_std::allocator<std::thread>_> *this_03;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  thread *in_stack_ffffffffffffff50;
  undefined1 local_98 [8];
  exception_ptr local_90;
  undefined1 local_88 [20];
  int local_74;
  duration<long,std::ratio<1l,1000l>> local_70 [8];
  duration<long,_std::ratio<1L,_1000L>_> *local_68;
  undefined4 local_5c;
  undefined8 local_58;
  ostream *in_stack_ffffffffffffffb0;
  real in_stack_ffffffffffffffb8;
  real in_stack_ffffffffffffffbc;
  FastText *in_stack_ffffffffffffffc0;
  real local_34;
  vector<std::thread,_std::allocator<std::thread>_> local_30;
  exception_ptr local_18;
  undefined8 local_10;
  
  local_10 = std::chrono::_V2::steady_clock::now();
  *(undefined8 *)(in_RDI + 0x60) = local_10;
  std::__atomic_base<long>::operator=
            ((__atomic_base<long> *)in_stack_ffffffffffffff30,
             (__int_type_conflict)in_stack_ffffffffffffff28);
  std::atomic<float>::operator=
            ((atomic<float> *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff1c);
  std::__exception_ptr::exception_ptr::exception_ptr(&local_18,(nullptr_t)0x0);
  std::__exception_ptr::exception_ptr::operator=
            ((exception_ptr *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)in_stack_ffffffffffffff20);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x191eb1);
  for (local_34 = 0.0;
      peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x191ed1), (int)local_34 < peVar3->thread;
      local_34 = (real)((int)local_34 + 1)) {
    in_stack_ffffffffffffffb0 = in_RDI;
    in_stack_ffffffffffffffb8 = local_34;
    std::thread::thread<fasttext::FastText::startThreads()::__0,,void>
              (in_stack_ffffffffffffff50,
               (type *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              (in_stack_ffffffffffffff20,
               (value_type *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    std::thread::~thread((thread *)0x191f3a);
  }
  this_00 = std::__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x191f9d);
  __rtime = (duration<long,_std::ratio<1L,_1000L>_> *)Dictionary::ntokens(this_00);
  local_68 = __rtime;
  while (bVar2 = keepTraining(in_stack_ffffffffffffff30,(int64_t)in_stack_ffffffffffffff28), bVar2)
  {
    local_74 = 100;
    std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>(local_70,&local_74);
    std::this_thread::sleep_for<long,std::ratio<1l,1000l>>(__rtime);
    fVar5 = std::atomic::operator_cast_to_float((atomic<float> *)0x192007);
    if ((0.0 <= fVar5) &&
       (peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x19201f), 1 < peVar3->verbose)) {
      _Var4 = std::__atomic_base::operator_cast_to_long
                        ((__atomic_base<long> *)in_stack_ffffffffffffff28);
      fVar5 = (float)_Var4;
      peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x19204f);
      local_88._16_4_ = fVar5 / (float)((long)peVar3->epoch * (long)local_68);
      std::operator<<((ostream *)&std::cerr,"\r");
      std::atomic::operator_cast_to_float((atomic<float> *)0x1920a6);
      printInfo(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
                in_stack_ffffffffffffffb0);
    }
  }
  for (local_88._12_4_ = 0; uVar1 = local_88._12_4_,
      peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1920e4), (int)uVar1 < peVar3->thread;
      local_88._12_4_ = local_88._12_4_ + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[]
              (&local_30,(long)(int)local_88._12_4_);
    std::thread::join();
  }
  bVar2 = std::__exception_ptr::exception_ptr::operator_cast_to_bool
                    ((exception_ptr *)(in_RDI + 0x80));
  if (bVar2) {
    this_01 = in_RDI + 0x80;
    this_03 = (vector<std::thread,_std::allocator<std::thread>_> *)local_88;
    std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)this_01,
               (exception_ptr *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    this_02 = &local_90;
    std::__exception_ptr::exception_ptr::exception_ptr(this_02,(nullptr_t)0x0);
    std::__exception_ptr::exception_ptr::operator=((exception_ptr *)this_03,this_02);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)this_01);
    std::__exception_ptr::exception_ptr::exception_ptr
              ((exception_ptr *)this_01,
               (exception_ptr *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
    auVar6 = std::rethrow_exception((exception_ptr)local_98);
    local_5c = auVar6._8_4_;
    local_58 = auVar6._0_8_;
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)this_01);
    std::__exception_ptr::exception_ptr::~exception_ptr((exception_ptr *)this_01);
    std::vector<std::thread,_std::allocator<std::thread>_>::~vector(this_03);
    _Unwind_Resume(local_58);
  }
  peVar3 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1921d8);
  if (0 < peVar3->verbose) {
    std::operator<<((ostream *)&std::cerr,"\r");
    std::atomic::operator_cast_to_float((atomic<float> *)0x192204);
    printInfo(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8,
              in_stack_ffffffffffffffb0);
    std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)in_stack_ffffffffffffff30);
  return;
}

Assistant:

void FastText::startThreads() {
  start_ = std::chrono::steady_clock::now();
  tokenCount_ = 0;
  loss_ = -1;
  trainException_ = nullptr;
  std::vector<std::thread> threads;
  for (int32_t i = 0; i < args_->thread; i++) {
    threads.push_back(std::thread([=]() { trainThread(i); }));
  }
  const int64_t ntokens = dict_->ntokens();
  // Same condition as trainThread
  while (keepTraining(ntokens)) {
    std::this_thread::sleep_for(std::chrono::milliseconds(100));
    if (loss_ >= 0 && args_->verbose > 1) {
      real progress = real(tokenCount_) / (args_->epoch * ntokens);
      std::cerr << "\r";
      printInfo(progress, loss_, std::cerr);
    }
  }
  for (int32_t i = 0; i < args_->thread; i++) {
    threads[i].join();
  }
  if (trainException_) {
    std::exception_ptr exception = trainException_;
    trainException_ = nullptr;
    std::rethrow_exception(exception);
  }
  if (args_->verbose > 0) {
    std::cerr << "\r";
    printInfo(1.0, loss_, std::cerr);
    std::cerr << std::endl;
  }
}